

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O0

void ImPlot::PushPlotClipRect(float expand)

{
  undefined1 local_28 [8];
  ImRect rect;
  ImPlotContext *gp;
  float expand_local;
  
  rect.Max = (ImVec2)GImPlot;
  local_28 = *(undefined1 (*) [8])&(GImPlot->CurrentPlot->PlotRect).Min;
  rect.Min = (GImPlot->CurrentPlot->PlotRect).Max;
  ImRect::Expand((ImRect *)local_28,expand);
  if (*(long *)((long)rect.Max + 0x28) == 0) {
    __assert_fail("(gp.CurrentPlot != __null) && \"PushPlotClipRect() needs to be called between BeginPlot() and EndPlot()!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                  ,0xa6e,"void ImPlot::PushPlotClipRect(float)");
  }
  ImGui::PushClipRect((ImVec2 *)local_28,&rect.Min,true);
  return;
}

Assistant:

void PushPlotClipRect(float expand) {
    ImPlotContext& gp = *GImPlot;
    ImRect rect = gp.CurrentPlot->PlotRect;
    rect.Expand(expand);
    IM_ASSERT_USER_ERROR(gp.CurrentPlot != NULL, "PushPlotClipRect() needs to be called between BeginPlot() and EndPlot()!");
    ImGui::PushClipRect(rect.Min, rect.Max, true);
}